

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,MethodInvocation *ptr)

{
  Expr *second;
  Expressions *second_00;
  MethodInvocation *pMVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  MethodInvocation *local_18;
  MethodInvocation *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (MethodInvocation *)this;
  std::operator+(&local_38,"method invocation: ",ptr->name);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pMVar1 = local_18;
  second = local_18->from;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"caller",&local_69);
  arrow(this,pMVar1,second,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (**(local_18->from->super_Base)._vptr_Base)(local_18->from,this);
  pMVar1 = local_18;
  second_00 = local_18->args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"args",&local_91);
  arrow(this,pMVar1,second_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  (**(local_18->args->super_Base)._vptr_Base)(local_18->args,this);
  return;
}

Assistant:

void gv_visitor::visit(MethodInvocation* ptr) {
    box(ptr, "method invocation: " + *ptr->name);
    arrow(ptr, ptr->from, "caller");
    ptr->from->accept(this);
    arrow(ptr, ptr->args, "args");
    ptr->args->accept(this);
    //name
}